

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

int __thiscall
spdlog::pattern_formatter::clone
          (pattern_formatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  pointer pcVar2;
  mapped_type *this_00;
  undefined1 local_90 [32];
  reference local_70;
  value_type *it;
  const_iterator __end1;
  const_iterator __begin1;
  custom_flags *__range1;
  custom_flags cloned_custom_formatters;
  pattern_formatter *this_local;
  
  cloned_custom_formatters._M_h._M_single_bucket = (__node_base_ptr)__fn;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                   *)&__range1);
  __end1 = std::
           unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
           ::begin((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)(__fn + 0xa8));
  it = (value_type *)
       std::
       unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
       ::end((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
              *)(__fn + 0xa8));
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                         *)&it);
    if (!bVar1) break;
    local_70 = std::__detail::
               _Node_const_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
               ::operator*(&__end1);
    pcVar2 = std::
             unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
             ::operator->(&local_70->second);
    (**(code **)(*(long *)pcVar2 + 0x18))(local_90 + 0x18);
    this_00 = std::
              unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
              ::operator[]((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                            *)&__range1,&local_70->first);
    std::
    unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>::
    operator=(this_00,(unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
                       *)(local_90 + 0x18));
    std::
    unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
                 *)(local_90 + 0x18));
    std::__detail::
    _Node_const_iterator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  std::
  make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&,spdlog::pattern_time_type_const&,std::__cxx11::string_const&,std::unordered_map<char,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (pattern_time_type *)(__fn + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 0x48),
             (unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
              *)(__fn + 0x28));
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>,void>
            ((unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>> *)this,
             (unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)local_90);
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
               *)local_90);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)&__range1);
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> pattern_formatter::clone() const
{
    custom_flags cloned_custom_formatters;
    for (auto &it : custom_handlers_)
    {
        cloned_custom_formatters[it.first] = it.second->clone();
    }
    return details::make_unique<pattern_formatter>(pattern_, pattern_time_type_, eol_, std::move(cloned_custom_formatters));
}